

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

void optimized::outputTileData(UniqueTiles *tiles)

{
  TileData *this;
  bool bVar1;
  _Ios_Openmode __oflag;
  int iVar2;
  path *ppVar3;
  undefined4 extraout_var;
  char *pcVar4;
  int *piVar5;
  char *pcVar6;
  reference ppTVar7;
  streambuf *psVar8;
  array<unsigned_char,_16UL> *this_00;
  const_pointer pvVar9;
  TileData *tile;
  __normal_iterator<const_TileData_*const_*,_std::vector<const_TileData_*,_std::allocator<const_TileData_*>_>_>
  local_150;
  __normal_iterator<const_TileData_*const_*,_std::vector<const_TileData_*,_std::allocator<const_TileData_*>_>_>
  end;
  const_iterator iter;
  undefined1 local_138 [6];
  uint16_t tileID;
  undefined1 local_108 [8];
  File output;
  UniqueTiles *tiles_local;
  
  output._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._240_8_ =
       tiles;
  File::File((File *)local_108);
  ppVar3 = std::optional<std::filesystem::__cxx11::path>::operator*(&options.output);
  __oflag = std::operator|(_S_out,_S_bin);
  iVar2 = File::open((File *)local_108,(char *)ppVar3,__oflag);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    ppVar3 = std::optional<std::filesystem::__cxx11::path>::operator*(&options.output);
    File::string((string *)local_138,(File *)local_108,ppVar3);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_138);
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fatal("Failed to create \"%s\": %s",pcVar4,pcVar6);
  }
  iter._M_current._6_2_ = 0;
  end._M_current =
       (TileData **)
       UniqueTiles::begin((UniqueTiles *)
                          output._file.
                          super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                          .
                          super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                          .
                          super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                          .
                          super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                          .
                          super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                          .
                          super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                          ._240_8_);
  tile = (TileData *)
         UniqueTiles::end((UniqueTiles *)
                          output._file.
                          super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                          .
                          super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                          .
                          super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                          .
                          super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                          .
                          super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                          .
                          super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                          ._240_8_);
  local_150 = __gnu_cxx::
              __normal_iterator<const_TileData_*const_*,_std::vector<const_TileData_*,_std::allocator<const_TileData_*>_>_>
              ::operator-((__normal_iterator<const_TileData_*const_*,_std::vector<const_TileData_*,_std::allocator<const_TileData_*>_>_>
                           *)&tile,options.trim);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_TileData_*const_*,_std::vector<const_TileData_*,_std::allocator<const_TileData_*>_>_>
                      (&end,&local_150);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      File::~File((File *)local_108);
      return;
    }
    ppTVar7 = __gnu_cxx::
              __normal_iterator<const_TileData_*const_*,_std::vector<const_TileData_*,_std::allocator<const_TileData_*>_>_>
              ::operator*(&end);
    this = *ppTVar7;
    if (this->tileID != iter._M_current._6_2_) break;
    iter._M_current._6_2_ = iter._M_current._6_2_ + 1;
    psVar8 = File::operator->((File *)local_108);
    this_00 = TileData::data(this);
    pvVar9 = std::array<unsigned_char,_16UL>::data(this_00);
    std::streambuf::sputn((char *)psVar8,(long)pvVar9);
    __gnu_cxx::
    __normal_iterator<const_TileData_*const_*,_std::vector<const_TileData_*,_std::allocator<const_TileData_*>_>_>
    ::operator++(&end);
  }
  __assert_fail("tile->tileID == tileID",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                ,0x39e,"outputTileData");
}

Assistant:

static void outputTileData(UniqueTiles const &tiles) {
	File output;
	if (!output.open(*options.output, std::ios_base::out | std::ios_base::binary)) {
		fatal("Failed to create \"%s\": %s", output.string(*options.output).c_str(),
		      strerror(errno));
	}

	uint16_t tileID = 0;
	for (auto iter = tiles.begin(), end = tiles.end() - options.trim; iter != end; ++iter) {
		TileData const *tile = *iter;
		assert(tile->tileID == tileID);
		++tileID;
		output->sputn(reinterpret_cast<char const *>(tile->data().data()), options.bitDepth * 8);
	}
}